

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-pool.c
# Opt level: O2

MMDB_entry_data_list_s * data_pool_to_list(MMDB_data_pool_s *pool)

{
  ulong uVar1;
  MMDB_entry_data_list_s *pMVar2;
  size_t sVar3;
  MMDB_entry_data_list_s *pMVar4;
  long lVar5;
  ulong uVar6;
  size_t *psVar7;
  size_t sVar8;
  
  if ((pool != (MMDB_data_pool_s *)0x0) && ((uVar1 = pool->index, uVar1 != 0 || (pool->used != 0))))
  {
    uVar6 = 0;
    while (uVar6 <= uVar1) {
      psVar7 = pool->sizes + uVar6;
      if (uVar6 == uVar1) {
        psVar7 = &pool->used;
      }
      pMVar2 = pool->blocks[uVar6];
      sVar3 = *psVar7;
      sVar8 = sVar3;
      pMVar4 = pMVar2;
      while( true ) {
        sVar8 = sVar8 - 1;
        if (sVar8 == 0) break;
        pMVar4->next = pMVar4 + 1;
        pMVar4 = pMVar4 + 1;
      }
      if (uVar6 < uVar1) {
        lVar5 = uVar6 + 1;
        uVar6 = uVar6 + 1;
        pMVar2[sVar3 - 1].next = pool->blocks[lVar5];
      }
      else {
        uVar6 = uVar6 + 1;
      }
    }
    return pool->blocks[0];
  }
  return (MMDB_entry_data_list_s *)0x0;
}

Assistant:

MMDB_entry_data_list_s *data_pool_to_list(MMDB_data_pool_s *const pool) {
    if (!pool) {
        return NULL;
    }

    if (pool->index == 0 && pool->used == 0) {
        return NULL;
    }

    for (size_t i = 0; i <= pool->index; i++) {
        MMDB_entry_data_list_s *const block = pool->blocks[i];

        size_t size = pool->sizes[i];
        if (i == pool->index) {
            size = pool->used;
        }

        for (size_t j = 0; j < size - 1; j++) {
            MMDB_entry_data_list_s *const cur = block + j;
            cur->next = block + j + 1;
        }

        if (i < pool->index) {
            MMDB_entry_data_list_s *const last = block + size - 1;
            last->next = pool->blocks[i + 1];
        }
    }

    return pool->blocks[0];
}